

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

void __thiscall HttpSession::on_read(HttpSession *this,error_code eCode,size_t bytes_transferred)

{
  element_type *peVar1;
  ulong uVar2;
  error_category *peVar3;
  
  peVar3 = eCode.cat_;
  uVar2 = eCode._0_8_ >> 0x20;
  if (eCode.val_ == 1) {
    if (peVar3 == (error_category *)
                  boost::beast::http::make_error_code(boost::beast::http::error)::cat) {
      peVar1 = (this->stream).impl_.px;
      boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::shutdown
                ((peVar1->socket).
                 super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 .impl_.service_,(int)peVar1 + 0x18,1);
      return;
    }
    if ((uVar2 & 1) == 0) {
LAB_00224fde:
      handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>
                (&this->req,&this->lambda);
      return;
    }
    if (peVar3->id_ == 0 &&
        peVar3 == (error_category *)boost::beast::make_error_code(boost::beast::error)::cat) {
      return;
    }
  }
  else if ((uVar2 & 1) == 0) goto LAB_00224fde;
  fail(eCode,"helics web server read");
  return;
}

Assistant:

void on_read(beast::error_code eCode, std::size_t bytes_transferred)
    {
        boost::ignore_unused(bytes_transferred);

        // This means they closed the connection
        if (eCode == http::error::end_of_stream) {
            return do_close();
        }

        if (eCode) {
            if (beast::error::timeout != eCode) {
                fail(eCode, "helics web server read");
            }
            return;
        }

        // Send the response
        handle_request(std::move(req), lambda);
    }